

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBlock * AnalyzeBlock(ExpressionContext *ctx,SynBlock *syntax,bool createScope)

{
  TypeBase *pTVar1;
  ScopeData *pSVar2;
  int iVar3;
  ExprBase *pEVar4;
  undefined4 extraout_var;
  SynBase *pSVar6;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  FunctionData *onwerFunction;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprBase> local_48;
  ExprBase *local_38;
  ExprBase *pEStack_30;
  ExprBlock *pEVar5;
  
  if ((int)CONCAT71(in_register_00000011,createScope) == 0) {
    local_48.head = (ExprBase *)0x0;
    local_48.tail = (ExprBase *)0x0;
    for (pSVar6 = (syntax->expressions).head; pSVar6 != (SynBase *)0x0; pSVar6 = pSVar6->next) {
      pEVar4 = AnalyzeStatement(ctx,pSVar6);
      IntrusiveList<ExprBase>::push_back(&local_48,pEVar4);
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar5 = (ExprBlock *)CONCAT44(extraout_var_00,iVar3);
    pTVar1 = ctx->typeVoid;
    (pEVar5->super_ExprBase).typeID = 0x36;
    (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar5->super_ExprBase).type = pTVar1;
    (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar5->super_ExprBase).listed = false;
    (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6c88;
    (pEVar5->expressions).head = local_48.head;
    (pEVar5->expressions).tail = local_48.tail;
    pEVar5->closures = (ExprBase *)0x0;
  }
  else {
    ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
    local_48.head = (ExprBase *)0x0;
    local_48.tail = (ExprBase *)0x0;
    for (pSVar6 = (syntax->expressions).head; pSVar6 != (SynBase *)0x0; pSVar6 = pSVar6->next) {
      pEVar4 = AnalyzeStatement(ctx,pSVar6);
      IntrusiveList<ExprBase>::push_back(&local_48,pEVar4);
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar5 = (ExprBlock *)CONCAT44(extraout_var,iVar3);
    pTVar1 = ctx->typeVoid;
    local_38 = local_48.head;
    pEStack_30 = local_48.tail;
    pSVar6 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    for (pSVar2 = ctx->scope; (pSVar2 != (ScopeData *)0x0 && (pSVar2->ownerType == (TypeBase *)0x0))
        ; pSVar2 = pSVar2->scope) {
      onwerFunction = pSVar2->ownerFunction;
      if (onwerFunction != (FunctionData *)0x0) goto LAB_001fb8c1;
    }
    onwerFunction = (FunctionData *)0x0;
LAB_001fb8c1:
    pEVar4 = CreateBlockUpvalueClose(ctx,pSVar6,onwerFunction,ctx->scope);
    (pEVar5->super_ExprBase).typeID = 0x36;
    (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar5->super_ExprBase).type = pTVar1;
    (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar5->super_ExprBase).listed = false;
    (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6c88;
    (pEVar5->expressions).head = local_38;
    (pEVar5->expressions).tail = pEStack_30;
    pEVar5->closures = pEVar4;
    ExpressionContext::PopScope(ctx,SCOPE_EXPLICIT,true);
  }
  return pEVar5;
}

Assistant:

ExprBlock* AnalyzeBlock(ExpressionContext &ctx, SynBlock *syntax, bool createScope)
{
	if(createScope)
	{
		ctx.PushScope(SCOPE_EXPLICIT);

		IntrusiveList<ExprBase> expressions;

		for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
			expressions.push_back(AnalyzeStatement(ctx, expression));

		ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

		ctx.PopScope(SCOPE_EXPLICIT);

		return block;
	}

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	return new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, NULL);
}